

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_converter.cc
# Opt level: O3

void __thiscall
webrtc::AudioConverter::CheckSizes(AudioConverter *this,size_t src_size,size_t dst_capacity)

{
  string *result;
  int line;
  size_t local_198;
  size_t local_190;
  FatalMessage local_188;
  
  local_188._0_8_ = this->src_frames_ * this->src_channels_;
  local_198 = dst_capacity;
  local_190 = src_size;
  if (local_188._0_8_ - src_size != 0) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&local_190,(unsigned_long *)&local_188,
                        "src_size == src_channels() * src_frames()");
    if (result != (string *)0x0) {
      line = 0xca;
      goto LAB_0013fc60;
    }
  }
  local_188._0_8_ = this->dst_frames_ * this->dst_channels_;
  if (dst_capacity <= (ulong)local_188._0_8_ && local_188._0_8_ - dst_capacity != 0) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&local_198,(unsigned_long *)&local_188,
                        "dst_capacity >= dst_channels() * dst_frames()");
    if (result != (string *)0x0) {
      line = 0xcb;
LAB_0013fc60:
      rtc::FatalMessage::FatalMessage
                (&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/audio_converter.cc"
                 ,line,result);
      rtc::FatalMessage::~FatalMessage(&local_188);
    }
  }
  return;
}

Assistant:

void AudioConverter::CheckSizes(size_t src_size, size_t dst_capacity) const {
  RTC_CHECK_EQ(src_size, src_channels() * src_frames());
  RTC_CHECK_GE(dst_capacity, dst_channels() * dst_frames());
}